

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heapmanager.h
# Opt level: O0

void __thiscall
Hoard::HeapManager<HL::SpinLockType,_Hoard::HoardHeap<2048,_128>_>::HeapManager
          (HeapManager<HL::SpinLockType,_Hoard::HoardHeap<2048,_128>_> *this)

{
  mutex_type *in_RDI;
  ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap> *this_00;
  int i_1;
  int i;
  lock_guard<HL::SpinLockType> g;
  int local_28;
  int local_24;
  
  HoardHeap<2048,_128>::HoardHeap((HoardHeap<2048,_128> *)0x11aa37);
  this_00 = (ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap> *)(in_RDI + 0x537e8);
  HL::SpinLockType::SpinLockType((SpinLockType *)0x11aa4c);
  std::lock_guard<HL::SpinLockType>::lock_guard((lock_guard<HL::SpinLockType> *)this_00,in_RDI);
  for (local_24 = 0; local_24 < 0x800; local_24 = local_24 + 1) {
    ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>::setTidMap
              (this_00,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  }
  for (local_28 = 0; local_28 < 0x80; local_28 = local_28 + 1) {
    ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>::setInusemap
              (this_00,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  }
  std::lock_guard<HL::SpinLockType>::~lock_guard((lock_guard<HL::SpinLockType> *)0x11ab0d);
  return;
}

Assistant:

HeapManager()
    {
      std::lock_guard<LockType> g (heapLock);
      
      /// Initialize all heap maps (nothing yet assigned).
      for (auto i = 0; i < HeapType::MaxThreads; i++) {
	HeapType::setTidMap (i, 0);
      }
      for (auto i = 0; i < HeapType::MaxHeaps; i++) {
	HeapType::setInusemap (i, 0);
      }
    }